

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O1

XMLURL * __thiscall xercesc_4_0::XMLURL::operator=(XMLURL *this,XMLURL *toAssign)

{
  short *psVar1;
  MemoryManager *pMVar2;
  XMLCh *pXVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  size_t sVar6;
  XMLCh *pXVar5;
  
  if (this != toAssign) {
    cleanUp(this);
    pMVar2 = toAssign->fMemoryManager;
    this->fMemoryManager = pMVar2;
    pXVar3 = toAssign->fFragment;
    if (pXVar3 == (XMLCh *)0x0) {
      pXVar5 = (XMLCh *)0x0;
    }
    else {
      sVar6 = 0;
      do {
        psVar1 = (short *)((long)pXVar3 + sVar6);
        sVar6 = sVar6 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,sVar6);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var,iVar4);
      memcpy(pXVar5,pXVar3,sVar6);
    }
    this->fFragment = pXVar5;
    pXVar3 = toAssign->fHost;
    if (pXVar3 == (XMLCh *)0x0) {
      pXVar5 = (XMLCh *)0x0;
    }
    else {
      sVar6 = 0;
      do {
        psVar1 = (short *)((long)pXVar3 + sVar6);
        sVar6 = sVar6 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
      memcpy(pXVar5,pXVar3,sVar6);
    }
    this->fHost = pXVar5;
    pXVar3 = toAssign->fPassword;
    if (pXVar3 == (XMLCh *)0x0) {
      pXVar5 = (XMLCh *)0x0;
    }
    else {
      sVar6 = 0;
      do {
        psVar1 = (short *)((long)pXVar3 + sVar6);
        sVar6 = sVar6 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var_01,iVar4);
      memcpy(pXVar5,pXVar3,sVar6);
    }
    this->fPassword = pXVar5;
    pXVar3 = toAssign->fPath;
    if (pXVar3 == (XMLCh *)0x0) {
      pXVar5 = (XMLCh *)0x0;
    }
    else {
      sVar6 = 0;
      do {
        psVar1 = (short *)((long)pXVar3 + sVar6);
        sVar6 = sVar6 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var_02,iVar4);
      memcpy(pXVar5,pXVar3,sVar6);
    }
    this->fPath = pXVar5;
    this->fPortNum = toAssign->fPortNum;
    this->fProtocol = toAssign->fProtocol;
    pXVar3 = toAssign->fQuery;
    if (pXVar3 == (XMLCh *)0x0) {
      pXVar5 = (XMLCh *)0x0;
    }
    else {
      sVar6 = 0;
      do {
        psVar1 = (short *)((long)pXVar3 + sVar6);
        sVar6 = sVar6 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var_03,iVar4);
      memcpy(pXVar5,pXVar3,sVar6);
    }
    this->fQuery = pXVar5;
    pXVar3 = toAssign->fUser;
    if (pXVar3 == (XMLCh *)0x0) {
      pXVar5 = (XMLCh *)0x0;
    }
    else {
      sVar6 = 0;
      do {
        psVar1 = (short *)((long)pXVar3 + sVar6);
        sVar6 = sVar6 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var_04,iVar4);
      memcpy(pXVar5,pXVar3,sVar6);
    }
    this->fUser = pXVar5;
    pXVar3 = toAssign->fURLText;
    if (pXVar3 == (XMLCh *)0x0) {
      pXVar5 = (XMLCh *)0x0;
    }
    else {
      sVar6 = 0;
      do {
        psVar1 = (short *)((long)pXVar3 + sVar6);
        sVar6 = sVar6 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar6);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var_05,iVar4);
      memcpy(pXVar5,pXVar3,sVar6);
    }
    this->fURLText = pXVar5;
    this->fHasInvalidChar = toAssign->fHasInvalidChar;
  }
  return this;
}

Assistant:

XMLURL& XMLURL::operator=(const XMLURL& toAssign)
{
    if (this == &toAssign)
        return *this;

    // Clean up our stuff
    cleanUp();

    // And copy his stuff
    fMemoryManager = toAssign.fMemoryManager;
    fFragment = XMLString::replicate(toAssign.fFragment, fMemoryManager);
    fHost = XMLString::replicate(toAssign.fHost, fMemoryManager);
    fPassword = XMLString::replicate(toAssign.fPassword, fMemoryManager);
    fPath = XMLString::replicate(toAssign.fPath, fMemoryManager);
    fPortNum = toAssign.fPortNum;
    fProtocol = toAssign.fProtocol;
    fQuery = XMLString::replicate(toAssign.fQuery, fMemoryManager);
    fUser = XMLString::replicate(toAssign.fUser, fMemoryManager);
    fURLText = XMLString::replicate(toAssign.fURLText, fMemoryManager);
    fHasInvalidChar = toAssign.fHasInvalidChar;

    return *this;
}